

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O1

void __thiscall
dgPolyhedra::ConvexPartition
          (dgPolyhedra *this,HaF64 *vertex,HaI32 strideInBytes,dgPolyhedra *leftOversOut)

{
  int *piVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  dgEdge *pdVar6;
  dgPolyhedra *pdVar7;
  undefined1 auVar8 [16];
  byte bVar9;
  bool bVar10;
  int tmp;
  int iVar11;
  long lVar12;
  long lVar13;
  dgEdge *pdVar14;
  long lVar15;
  dgRedBackNode *pdVar16;
  dgTreeNode *pdVar17;
  ulong uVar18;
  uint uVar19;
  dgEdge *pdVar20;
  double dVar21;
  dgRedBackNode *pdVar22;
  uint uVar23;
  dgRedBackNode *pdVar24;
  dgEdge *pdVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  float fVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  double dVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  double dVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  Iterator iter_2;
  dgPolyhedra flatFace;
  Iterator iter;
  Iterator iter_3;
  dgPolyhedra buildConvex;
  Iterator iter_1;
  HaI32 polygon [8192];
  dgEdge *diagonalsPool [8192];
  uint uStack_1a184;
  Iterator IStack_1a138;
  undefined1 auStack_1a128 [16];
  undefined1 auStack_1a118 [16];
  undefined1 auStack_1a108 [16];
  undefined1 auStack_1a0f8 [16];
  double dStack_1a0e8;
  dgPolyhedra dStack_1a0e0;
  Iterator IStack_1a0b8;
  dgPolyhedra *pdStack_1a0a8;
  Iterator IStack_1a0a0;
  ulong uStack_1a090;
  double dStack_1a088;
  double dStack_1a080;
  double dStack_1a078;
  double dStack_1a070;
  double dStack_1a068;
  dgPolyhedra dStack_1a060;
  dgBigVector adStack_1a038 [256];
  HaI32 HStack_18038;
  int aiStack_18034 [8191];
  long alStack_10038 [8193];
  
  if ((this->super_dgTree<dgEdge,_long>).m_count != 0) {
    Triangulate(this,vertex,strideInBytes,leftOversOut);
    DeleteDegenerateFaces(this,vertex,strideInBytes,9.999999747378752e-06);
    Optimize(this,vertex,strideInBytes,9.999999747378752e-05);
    DeleteDegenerateFaces(this,vertex,strideInBytes,9.999999747378752e-06);
    if ((this->super_dgTree<dgEdge,_long>).m_count != 0) {
      dgPolyhedra(&dStack_1a060);
      IStack_1a0b8.m_ptr = (dgRedBackNode *)0x0;
      pdVar17 = (this->super_dgTree<dgEdge,_long>).m_head;
      IStack_1a0b8.m_tree = &this->super_dgTree<dgEdge,_long>;
      if (pdVar17 == (dgTreeNode *)0x0) {
        IStack_1a0b8.m_ptr = (dgRedBackNode *)0x0;
      }
      else {
        IStack_1a0b8.m_ptr = dgRedBackNode::Minimum(&pdVar17->super_dgRedBackNode);
      }
      if (IStack_1a0b8.m_ptr != (dgRedBackNode *)0x0) {
        iVar11 = strideInBytes >> 3;
        lVar12 = (long)iVar11;
        pdStack_1a0a8 = this;
        do {
          pdVar16 = IStack_1a0b8.m_ptr;
          dgTree<dgEdge,_long>::Iterator::operator++(&IStack_1a0b8,0);
          if (0 < *(int *)((long)&pdVar16[1]._vptr_dgRedBackNode + 4)) {
            dgPolyhedra(&dStack_1a0e0);
            MarkAdjacentCoplanarFaces
                      (this,&dStack_1a0e0,(dgEdge *)(pdVar16 + 1),vertex,strideInBytes);
            if (dStack_1a0e0.super_dgTree<dgEdge,_long>.m_count != 0) {
              pdVar25 = (dgEdge *)vertex;
              RefineTriangulation(&dStack_1a0e0,vertex,iVar11);
              uVar19 = dStack_1a0e0.m_edgeMark + 1;
              dStack_1a0e0.m_edgeMark = uVar19;
              if (uVar19 == 0x7fffffff) {
LAB_0088272c:
                __assert_fail("m_edgeMark < 0x7fffffff",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.h"
                              ,0xe5,"hacd::HaI32 dgPolyhedra::IncLRU() const");
              }
              IStack_1a138.m_ptr = (dgRedBackNode *)0x0;
              IStack_1a138.m_tree = &dStack_1a0e0.super_dgTree<dgEdge,_long>;
              if (dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head == (dgTreeNode *)0x0) {
                IStack_1a138.m_ptr = (dgRedBackNode *)0x0;
              }
              else {
                IStack_1a138.m_ptr =
                     dgRedBackNode::Minimum
                               (&(dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head)->
                                 super_dgRedBackNode);
              }
              uVar23 = 0;
              while (IStack_1a138.m_ptr != (dgRedBackNode *)0x0) {
                if ((*(int *)((long)&IStack_1a138.m_ptr[1]._vptr_dgRedBackNode + 4) < 0) &&
                   (*(uint *)&IStack_1a138.m_ptr[2]._vptr_dgRedBackNode != uVar19)) {
                  pdVar22 = IStack_1a138.m_ptr + 1;
                  pdVar16 = pdVar22;
                  do {
                    *(uint *)&pdVar16[1]._vptr_dgRedBackNode = uVar19;
                    pdVar16 = pdVar16->m_right;
                  } while (pdVar16 != pdVar22);
                  (&adStack_1a038[0].super_dgTemplateVector<double>.m_x)[(int)uVar23] =
                       (double)pdVar22;
                  if (0x3fe < (int)uVar23) {
                    __assert_fail("perimeterCount < hacd::HaI32 (sizeof (edgePerimeters) / sizeof (edgePerimeters[0]))"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                  ,0xddf,
                                  "void RemoveColinearVertices(dgPolyhedra &, const hacd::HaF64 *const, hacd::HaI32)"
                                 );
                  }
                  uVar23 = uVar23 + 1;
                }
                pdVar25 = (dgEdge *)0x0;
                dgTree<dgEdge,_long>::Iterator::operator++(&IStack_1a138,0);
              }
              if (0 < (int)uVar23) {
                dStack_1a0e8 = (double)(ulong)uVar23;
                dVar21 = 0.0;
                do {
                  pdVar14 = (dgEdge *)
                            (&adStack_1a038[0].super_dgTemplateVector<double>.m_x)[(long)dVar21];
                  lVar13 = pdVar14->m_incidentVertex * lVar12;
                  dVar42 = (double)vertex[lVar13 + 1];
                  dVar2 = (double)vertex[lVar13 + 2];
                  if ((((0x7fefffffffffffff < (ulong)ABS((double)vertex[lVar13])) ||
                       (0x7fefffffffffffff < (ulong)ABS(dVar42))) || (NAN(dVar42))) ||
                     ((0x7fefffffffffffff < (ulong)ABS(dVar2) || (NAN(dVar2))))) goto LAB_00882615;
                  fVar30 = (float)(double)vertex[lVar13];
                  fVar38 = (float)dVar42;
                  fVar40 = (float)dVar2;
                  if ((((0x7f7fffff < (uint)ABS(fVar30)) ||
                       ((0x7f7fffff < (uint)ABS(fVar38) || (NAN(fVar38))))) ||
                      (0x7f7fffff < (uint)ABS(fVar40))) || (NAN(fVar40))) {
LAB_00882634:
                    __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                                  ,0x12d,"dgVector::dgVector(const dgBigVector &)");
                  }
                  lVar13 = pdVar14->m_next->m_incidentVertex * lVar12;
                  dVar42 = (double)vertex[lVar13 + 1];
                  dVar2 = (double)vertex[lVar13 + 2];
                  if ((((0x7fefffffffffffff < (ulong)ABS((double)vertex[lVar13])) ||
                       (0x7fefffffffffffff < (ulong)ABS(dVar42))) || (NAN(dVar42))) ||
                     ((0x7fefffffffffffff < (ulong)ABS(dVar2) || (NAN(dVar2))))) goto LAB_00882615;
                  fVar51 = (float)(double)vertex[lVar13];
                  fVar59 = (float)dVar42;
                  fVar55 = (float)dVar2;
                  if (((0x7f7fffff < (uint)ABS(fVar51)) ||
                      ((0x7f7fffff < (uint)ABS(fVar59) || (NAN(fVar59))))) ||
                     ((0x7f7fffff < (uint)ABS(fVar55) || (NAN(fVar55))))) goto LAB_00882634;
                  fVar30 = fVar51 - fVar30;
                  fVar38 = fVar59 - fVar38;
                  fVar40 = fVar55 - fVar40;
                  if (((0x7f7fffff < (uint)ABS(fVar30)) || (0x7f7fffff < (uint)ABS(fVar38))) ||
                     (0x7f7fffff < (uint)ABS(fVar40))) {
LAB_008825f6:
                    __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                                  ,0x121,"dgVector::dgVector(const dgTemplateVector<hacd::HaF32> &)"
                                 );
                  }
                  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar38 * fVar38)),ZEXT416((uint)fVar30),
                                           ZEXT416((uint)fVar30));
                  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
                  if (auVar8._0_4_ < 0.0) {
                    auStack_1a0f8._0_4_ = fVar38;
                    auStack_1a108._0_4_ = fVar40;
                    fVar41 = sqrtf(auVar8._0_4_);
                    fVar38 = (float)auStack_1a0f8._0_4_;
                    fVar40 = (float)auStack_1a108._0_4_;
                  }
                  else {
                    auVar8 = vsqrtss_avx(auVar8,auVar8);
                    fVar41 = auVar8._0_4_;
                  }
                  fVar41 = 1.0 / (fVar41 + 1e-12);
                  if (((0x7f7fffff < (uint)ABS(fVar30 * fVar41)) ||
                      (0x7f7fffff < (uint)ABS(fVar38 * fVar41))) ||
                     (0x7f7fffff < (uint)ABS(fVar40 * fVar41))) goto LAB_008825f6;
                  auVar8._8_8_ = 0;
                  auVar8._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
                  auStack_1a108._4_12_ = SUB1612(auVar8 << 0x40,4);
                  auStack_1a108._0_4_ = fVar40 * fVar41;
                  auStack_1a0f8 =
                       vinsertps_avx(ZEXT416((uint)(fVar30 * fVar41)),
                                     ZEXT416((uint)(fVar38 * fVar41)),0x10);
                  pdVar20 = pdVar14;
                  do {
                    lVar13 = pdVar14->m_next->m_next->m_incidentVertex * lVar12;
                    dVar42 = (double)vertex[lVar13 + 1];
                    dVar2 = (double)vertex[lVar13 + 2];
                    if (((0x7fefffffffffffff < (ulong)ABS((double)vertex[lVar13])) ||
                        (0x7fefffffffffffff < (ulong)ABS(dVar42))) ||
                       ((NAN(dVar42) || ((0x7fefffffffffffff < (ulong)ABS(dVar2) || (NAN(dVar2))))))
                       ) goto LAB_00882615;
                    fVar40 = (float)(double)vertex[lVar13];
                    fVar30 = (float)dVar42;
                    fVar38 = (float)dVar2;
                    pdVar25 = (dgEdge *)(ulong)(uint)ABS(fVar38);
                    if ((0x7f7fffff < (uint)ABS(fVar40)) ||
                       ((((0x7f7fffff < (uint)ABS(fVar30) || (NAN(fVar30))) ||
                         (0x7f7fffff < (uint)ABS(fVar38))) || (NAN(fVar38))))) goto LAB_00882634;
                    fVar51 = fVar40 - fVar51;
                    fVar59 = fVar30 - fVar59;
                    fVar55 = fVar38 - fVar55;
                    if (((0x7f7fffff < (uint)ABS(fVar51)) || (0x7f7fffff < (uint)ABS(fVar59))) ||
                       (0x7f7fffff < (uint)ABS(fVar55))) goto LAB_008825f6;
                    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * fVar59)),ZEXT416((uint)fVar51),
                                             ZEXT416((uint)fVar51));
                    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
                    if (auVar8._0_4_ < 0.0) {
                      auStack_1a118._0_4_ = fVar59;
                      auStack_1a128._0_4_ = fVar55;
                      fVar41 = sqrtf(auVar8._0_4_);
                      fVar59 = (float)auStack_1a118._0_4_;
                      fVar55 = (float)auStack_1a128._0_4_;
                    }
                    else {
                      auVar8 = vsqrtss_avx(auVar8,auVar8);
                      fVar41 = auVar8._0_4_;
                    }
                    fVar41 = 1.0 / (fVar41 + 1e-12);
                    fVar51 = fVar51 * fVar41;
                    fVar59 = fVar59 * fVar41;
                    if (((0x7f7fffff < (uint)ABS(fVar51)) || (0x7f7fffff < (uint)ABS(fVar59))) ||
                       (0x7f7fffff < (uint)ABS(fVar55 * fVar41))) goto LAB_008825f6;
                    auVar34 = ZEXT416((uint)(fVar55 * fVar41));
                    auVar8 = vmovshdup_avx(auStack_1a0f8);
                    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ * fVar59)),
                                             ZEXT416((uint)fVar51),auStack_1a0f8);
                    auVar8 = vfmadd231ss_fma(auVar8,auVar34,ZEXT416((uint)auStack_1a108._0_4_));
                    auVar46 = ZEXT416((uint)fVar59);
                    if (auVar8._0_4_ <= 0.9999) {
LAB_00881b0d:
                      auStack_1a0f8 = vinsertps_avx(ZEXT416((uint)fVar51),auVar46,0x10);
                      auStack_1a108 = ZEXT416(auVar34._0_4_);
                      pdVar14 = pdVar14->m_next;
                      bVar9 = 0;
                    }
                    else {
                      while( true ) {
                        auStack_1a118 = auVar46;
                        auStack_1a128 = auVar34;
                        pdVar25 = pdVar14->m_twin;
                        pdVar20 = pdVar14->m_next->m_twin->m_next;
                        if (pdVar20 == pdVar25) break;
                        DeleteEdge(&dStack_1a0e0,pdVar20);
                        auVar34 = auStack_1a128;
                        auVar46 = auStack_1a118;
                      }
                      pdVar20 = pdVar25->m_next;
                      if (pdVar20->m_next->m_next == pdVar25) {
                        if (pdVar20->m_incidentFace < 1) {
                          __assert_fail("ptr->m_twin->m_next->m_incidentFace > 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                        ,0xdf8,
                                        "void RemoveColinearVertices(dgPolyhedra &, const hacd::HaF64 *const, hacd::HaI32)"
                                       );
                        }
                        DeleteEdge(&dStack_1a0e0,pdVar20);
                      }
                      pdVar20 = pdVar14->m_next;
                      pdVar6 = pdVar20->m_twin;
                      if (pdVar6->m_next->m_twin != pdVar14) {
                        __assert_fail("ptr->m_next->m_twin->m_next->m_twin == ptr",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                      ,0xdfc,
                                      "void RemoveColinearVertices(dgPolyhedra &, const hacd::HaF64 *const, hacd::HaI32)"
                                     );
                      }
                      pdVar25 = (dgEdge *)(long)pdVar14->m_incidentVertex;
                      auVar34 = auStack_1a128;
                      auVar46 = auStack_1a118;
                      if (dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head != (dgTreeNode *)0x0) {
                        uVar26 = (long)pdVar25 << 0x20 | (long)pdVar6->m_incidentVertex;
                        pdVar17 = dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head;
                        do {
                          lVar13 = 8;
                          if ((pdVar17->m_key <= (long)uVar26) &&
                             (lVar13 = 0x10, (long)uVar26 <= pdVar17->m_key)) goto LAB_00881b0d;
                          pdVar17 = *(dgTreeNode **)
                                     ((long)&(pdVar17->super_dgRedBackNode)._vptr_dgRedBackNode +
                                     lVar13);
                        } while (pdVar17 != (dgTreeNode *)0x0);
                      }
                      if (dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head != (dgTreeNode *)0x0) {
                        uVar26 = (long)pdVar6->m_incidentVertex << 0x20 | (ulong)pdVar25;
                        pdVar17 = dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head;
                        do {
                          pdVar25 = (dgEdge *)0x8;
                          if ((pdVar17->m_key <= (long)uVar26) &&
                             (pdVar25 = (dgEdge *)0x10, (long)uVar26 <= pdVar17->m_key))
                          goto LAB_00881b0d;
                          pdVar17 = *(dgTreeNode **)
                                     ((long)&pdVar25->m_incidentVertex +
                                     (long)&pdVar17->super_dgRedBackNode);
                        } while (pdVar17 != (dgTreeNode *)0x0);
                      }
                      pdVar25 = pdVar14->m_twin;
                      pdVar25->m_prev = pdVar6->m_prev;
                      pdVar6->m_prev->m_next = pdVar25;
                      pdVar25 = pdVar20->m_next;
                      pdVar25->m_prev = pdVar14;
                      pdVar14->m_next = pdVar25;
                      pdVar20->m_next = pdVar6;
                      pdVar20->m_prev = pdVar6;
                      pdVar6->m_next = pdVar20;
                      pdVar6->m_prev = pdVar20;
                      DeleteEdge(&dStack_1a0e0,pdVar20);
                      pdVar25 = pdVar14->m_twin;
                      bVar9 = 1;
                      ChangeEdgeIncidentVertex
                                (&dStack_1a0e0,pdVar25,pdVar14->m_next->m_incidentVertex);
                      pdVar20 = pdVar14;
                    }
                    fVar55 = fVar38;
                    fVar51 = fVar40;
                    fVar59 = fVar30;
                  } while ((bool)(pdVar14 != pdVar20 | bVar9));
                  dVar21 = (double)((long)dVar21 + 1);
                } while (dVar21 != dStack_1a0e8);
              }
              this = pdStack_1a0a8;
              uVar19 = dStack_1a0e0.m_edgeMark + 1;
              dStack_1a0e0.m_edgeMark = uVar19;
              if (uVar19 == 0x7fffffff) goto LAB_0088272c;
              adStack_1a038[0].super_dgTemplateVector<double>.m_x = 0.0;
              adStack_1a038[0].super_dgTemplateVector<double>.m_y = (double)&dStack_1a0e0;
              if (dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head == (dgTreeNode *)0x0) {
                adStack_1a038[0].super_dgTemplateVector<double>.m_x = 0.0;
              }
              else {
                adStack_1a038[0].super_dgTemplateVector<double>.m_x =
                     (double)dgRedBackNode::Minimum
                                       (&(dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head)->
                                         super_dgRedBackNode);
              }
              if ((dgRedBackNode *)adStack_1a038[0].super_dgTemplateVector<double>.m_x ==
                  (dgRedBackNode *)0x0) {
                uStack_1a184 = 0;
              }
              else {
                uStack_1a184 = 0;
                do {
                  if (((*(uint *)&((dgRedBackNode *)
                                  ((long)adStack_1a038[0].super_dgTemplateVector<double>.m_x + 0x50)
                                  )->_vptr_dgRedBackNode != uVar19) &&
                      (0 < *(int *)((long)&((dgRedBackNode *)
                                           ((long)adStack_1a038[0].super_dgTemplateVector<double>.
                                                  m_x + 0x28))->_vptr_dgRedBackNode + 4))) &&
                     (0 < *(int *)(*(long *)&((dgRedBackNode *)
                                             ((long)adStack_1a038[0].super_dgTemplateVector<double>.
                                                    m_x + 0x28))->field_0x20 + 4))) {
                    *(uint *)(*(long *)&((dgRedBackNode *)
                                        ((long)adStack_1a038[0].super_dgTemplateVector<double>.m_x +
                                        0x28))->field_0x20 + 0x28) = uVar19;
                    if ((int)uStack_1a184 < 0x2000) {
                      alStack_10038[(int)uStack_1a184] =
                           (long)((long)adStack_1a038[0].super_dgTemplateVector<double>.m_x + 0x28);
                      uStack_1a184 = uStack_1a184 + 1;
                    }
                    if (0x2000 < (int)uStack_1a184) {
                      __assert_fail("count <= maxCount",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                    ,0xe2d,
                                    "hacd::HaI32 GetInteriorDiagonals(dgPolyhedra &, dgEdge **const, hacd::HaI32)"
                                   );
                    }
                  }
                  *(uint *)&((dgRedBackNode *)
                            ((long)adStack_1a038[0].super_dgTemplateVector<double>.m_x + 0x50))->
                            _vptr_dgRedBackNode = uVar19;
                  pdVar25 = (dgEdge *)0x0;
                  dgTree<dgEdge,_long>::Iterator::operator++((Iterator *)adStack_1a038,0);
                } while ((dgRedBackNode *)adStack_1a038[0].super_dgTemplateVector<double>.m_x !=
                         (dgRedBackNode *)0x0);
              }
              if (uStack_1a184 != 0) {
                if (((dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head)->m_info).m_incidentFace < 0) {
                  pdVar14 = ((dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head)->m_info).m_twin;
                }
                else {
                  pdVar14 = &(dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head)->m_info;
                }
                if (pdVar14->m_incidentFace < 1) {
                  __assert_fail("edge->m_incidentFace > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                ,0xe82,
                                "void dgPolyhedra::ConvexPartition(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                               );
                }
                FaceNormal(adStack_1a038,(dgPolyhedra *)pdVar25,pdVar14,vertex,strideInBytes);
                dVar21 = adStack_1a038[0].super_dgTemplateVector<double>.m_z;
                dVar2 = adStack_1a038[0].super_dgTemplateVector<double>.m_y;
                dVar42 = adStack_1a038[0].super_dgTemplateVector<double>.m_x;
                auVar46._8_8_ = 0;
                auVar46._0_8_ = adStack_1a038[0].super_dgTemplateVector<double>.m_x;
                auVar34._8_8_ = 0;
                auVar34._0_8_ =
                     adStack_1a038[0].super_dgTemplateVector<double>.m_y *
                     adStack_1a038[0].super_dgTemplateVector<double>.m_y;
                auVar8 = vfmadd231sd_fma(auVar34,auVar46,auVar46);
                auVar53._8_8_ = 0;
                auVar53._0_8_ = adStack_1a038[0].super_dgTemplateVector<double>.m_z;
                auVar8 = vfmadd231sd_fma(auVar8,auVar53,auVar53);
                if (auVar8._0_8_ < 0.0) {
                  dVar31 = sqrt(auVar8._0_8_);
                }
                else {
                  auVar8 = vsqrtsd_avx(auVar8,auVar8);
                  dVar31 = auVar8._0_8_;
                }
                dVar31 = 1.0 / dVar31;
                pdVar16 = (dgRedBackNode *)(dVar42 * dVar31);
                pdVar7 = (dgPolyhedra *)(dVar2 * dVar31);
                dVar21 = dVar21 * dVar31;
                if (((0x7fefffffffffffff < (long)ABS((double)pdVar16)) ||
                    (0x7fefffffffffffff < (long)ABS((double)pdVar7))) ||
                   ((0x7fefffffffffffff < (long)ABS(dVar21) ||
                    (0x7fefffffffffffff <
                     (ulong)ABS(adStack_1a038[0].super_dgTemplateVector<double>.m_w)))))
                goto LAB_008826b0;
                adStack_1a038[0].super_dgTemplateVector<double>.m_x = (double)pdVar16;
                adStack_1a038[0].super_dgTemplateVector<double>.m_y = (double)pdVar7;
                adStack_1a038[0].super_dgTemplateVector<double>.m_z = dVar21;
                IStack_1a138.m_ptr = (dgRedBackNode *)0x0;
                if (dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head == (dgTreeNode *)0x0) {
                  IStack_1a138.m_ptr = (dgRedBackNode *)0x0;
                  IStack_1a138.m_tree = &dStack_1a0e0.super_dgTree<dgEdge,_long>;
                }
                else {
                  IStack_1a138.m_tree = &dStack_1a0e0.super_dgTree<dgEdge,_long>;
                  IStack_1a138.m_ptr =
                       dgRedBackNode::Minimum
                                 (&(dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head)->
                                   super_dgRedBackNode);
                }
                if (IStack_1a138.m_ptr == (dgRedBackNode *)0x0) {
                  pdVar22 = (dgRedBackNode *)0x0;
                }
                else {
                  do {
                    pdVar22 = IStack_1a138.m_ptr;
                    if (*(int *)((long)&IStack_1a138.m_ptr[1]._vptr_dgRedBackNode + 4) < 0) break;
                    dgTree<dgEdge,_long>::Iterator::operator++(&IStack_1a138,0);
                  } while (IStack_1a138.m_ptr != (dgRedBackNode *)0x0);
                  pdVar22 = pdVar22 + 1;
                }
                if (pdVar22 == (dgRedBackNode *)0x0) {
                  __assert_fail("edge",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                ,0xe8f,
                                "void dgPolyhedra::ConvexPartition(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                               );
                }
                uStack_1a090 = (ulong)(uint)dStack_1a0e0.m_edgeMark;
                uVar19 = dStack_1a0e0.m_edgeMark + 1;
                dStack_1a0e0.m_edgeMark = uVar19;
                if (uVar19 == 0x7fffffff) goto LAB_0088272c;
                lVar13 = *(int *)&pdVar22->m_parent->_vptr_dgRedBackNode * lVar12;
                dVar42 = (double)vertex[lVar13 + 1];
                dVar2 = (double)vertex[lVar13 + 2];
                if (((0x7fefffffffffffff < (ulong)ABS((double)vertex[lVar13])) ||
                    (0x7fefffffffffffff < (ulong)ABS(dVar42))) ||
                   ((NAN(dVar42) || ((0x7fefffffffffffff < (ulong)ABS(dVar2) || (NAN(dVar2))))))) {
LAB_00882615:
                  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                                ,0x152,"dgBigVector::dgBigVector(const hacd::HaF64 *)");
                }
                lVar15 = *(int *)&pdVar22->_vptr_dgRedBackNode * lVar12;
                dVar3 = (double)vertex[lVar15];
                dVar60 = (double)vertex[lVar15 + 1];
                dVar31 = (double)vertex[lVar15 + 2];
                if ((0x7fefffffffffffff < (ulong)ABS(dVar3)) ||
                   ((((0x7fefffffffffffff < (ulong)ABS(dVar60) || (NAN(dVar60))) ||
                     (0x7fefffffffffffff < (ulong)ABS(dVar31))) || (NAN(dVar31)))))
                goto LAB_00882615;
                dVar45 = dVar3 - (double)vertex[lVar13];
                dVar42 = dVar60 - dVar42;
                dVar2 = dVar31 - dVar2;
                if (((0x7fefffffffffffff < (long)ABS(dVar45)) ||
                    (0x7fefffffffffffff < (long)ABS(dVar42))) ||
                   (0x7fefffffffffffff < (long)ABS(dVar2))) {
LAB_008826b0:
                  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                                ,0x145,
                                "dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
                }
                auVar35._8_8_ = 0;
                auVar35._0_8_ = dVar42 * dVar42;
                auVar47._8_8_ = 0;
                auVar47._0_8_ = dVar45;
                auVar8 = vfmadd231sd_fma(auVar35,auVar47,auVar47);
                auVar43._8_8_ = 0;
                auVar43._0_8_ = dVar2;
                auVar8 = vfmadd231sd_fma(auVar8,auVar43,auVar43);
                if (auVar8._0_8_ < 0.0) {
                  auStack_1a0f8._0_8_ = dVar60;
                  auStack_1a108._0_8_ = dVar31;
                  auStack_1a118._0_8_ = dVar45;
                  auStack_1a128._0_8_ = dVar42;
                  dVar32 = sqrt(auVar8._0_8_);
                  dVar45 = (double)auStack_1a118._0_8_;
                  dVar42 = (double)auStack_1a128._0_8_;
                  dVar60 = (double)auStack_1a0f8._0_8_;
                  dVar31 = (double)auStack_1a108._0_8_;
                }
                else {
                  auVar8 = vsqrtsd_avx(auVar8,auVar8);
                  dVar32 = auVar8._0_8_;
                }
                dVar32 = (double)(1.0 / ((float)dVar32 + 1e-14));
                auVar62 = ZEXT864((ulong)(dVar45 * dVar32));
                auVar64 = ZEXT864((ulong)(dVar42 * dVar32));
                auVar66 = ZEXT864((ulong)(dVar2 * dVar32));
                if (((0x7fefffffffffffff < (long)ABS(dVar45 * dVar32)) ||
                    (0x7fefffffffffffff < (long)ABS(dVar42 * dVar32))) ||
                   (0x7fefffffffffffff < (long)ABS(dVar2 * dVar32))) goto LAB_008826b0;
                bVar10 = true;
                pdVar24 = pdVar22;
                do {
                  auVar61 = auVar62._0_16_;
                  auVar63 = auVar64._0_16_;
                  auVar65 = auVar66._0_16_;
                  lVar13 = *(int *)&pdVar24->m_right->_vptr_dgRedBackNode * lVar12;
                  dVar42 = (double)vertex[lVar13];
                  dVar2 = (double)vertex[lVar13 + 1];
                  dVar45 = (double)vertex[lVar13 + 2];
                  if ((((0x7fefffffffffffff < (ulong)ABS(dVar42)) ||
                       (0x7fefffffffffffff < (ulong)ABS(dVar2))) || (NAN(dVar2))) ||
                     ((0x7fefffffffffffff < (ulong)ABS(dVar45) || (NAN(dVar45)))))
                  goto LAB_00882615;
                  dVar32 = dVar42 - dVar3;
                  dVar52 = dVar2 - dVar60;
                  dVar56 = dVar45 - dVar31;
                  if (((0x7fefffffffffffff < (long)ABS(dVar32)) ||
                      (0x7fefffffffffffff < (long)ABS(dVar52))) ||
                     (0x7fefffffffffffff < (long)ABS(dVar56))) goto LAB_008826b0;
                  auVar36._8_8_ = 0;
                  auVar36._0_8_ = dVar52 * dVar52;
                  auVar48._8_8_ = 0;
                  auVar48._0_8_ = dVar32;
                  auVar8 = vfmadd231sd_fma(auVar36,auVar48,auVar48);
                  auVar57._8_8_ = 0;
                  auVar57._0_8_ = dVar56;
                  auVar8 = vfmadd231sd_fma(auVar8,auVar57,auVar57);
                  if (auVar8._0_8_ < 0.0) {
                    auStack_1a0f8._0_8_ = dVar60;
                    auStack_1a108._0_8_ = dVar31;
                    auStack_1a118._0_8_ = auVar62._0_8_;
                    auStack_1a128._0_8_ = auVar64._0_8_;
                    auVar65._0_8_ = auVar66._0_8_;
                    dStack_1a0e8 = dVar42;
                    dStack_1a088 = dVar56;
                    dStack_1a080 = dVar52;
                    dStack_1a078 = dVar32;
                    dStack_1a070 = dVar45;
                    dStack_1a068 = dVar2;
                    dVar33 = sqrt(auVar8._0_8_);
                    auVar65._8_8_ = 0;
                    auVar63._8_8_ = 0;
                    auVar63._0_8_ = auStack_1a128._0_8_;
                    auVar61._8_8_ = 0;
                    auVar61._0_8_ = auStack_1a118._0_8_;
                    dVar32 = dStack_1a078;
                    dVar52 = dStack_1a080;
                    dVar56 = dStack_1a088;
                    dVar3 = dStack_1a0e8;
                    dVar60 = dStack_1a068;
                    dVar31 = dStack_1a070;
                  }
                  else {
                    auVar8 = vsqrtsd_avx(auVar8,auVar8);
                    dVar33 = auVar8._0_8_;
                    dVar3 = dVar42;
                    dVar60 = dVar2;
                    dVar31 = dVar45;
                  }
                  dVar42 = 1.0 / (dVar33 + 9.9999998245167e-15);
                  dVar32 = dVar32 * dVar42;
                  dVar52 = dVar52 * dVar42;
                  dVar56 = dVar56 * dVar42;
                  if (((0x7fefffffffffffff < (long)ABS(dVar32)) ||
                      (0x7fefffffffffffff < (long)ABS(dVar52))) ||
                     (0x7fefffffffffffff < (long)ABS(dVar56))) goto LAB_008826b0;
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = dVar56;
                  auVar54._8_8_ = 0;
                  auVar54._0_8_ = auVar65._0_8_ * dVar52;
                  auVar8 = vfmsub231sd_fma(auVar54,auVar63,auVar44);
                  auVar37._8_8_ = 0;
                  auVar37._0_8_ = dVar32;
                  auVar49._8_8_ = 0;
                  auVar49._0_8_ = auVar61._0_8_ * dVar56;
                  auVar34 = vfmsub231sd_fma(auVar49,auVar65,auVar37);
                  auVar39._8_8_ = 0;
                  auVar39._0_8_ = dVar52;
                  auVar58._8_8_ = 0;
                  auVar58._0_8_ = auVar63._0_8_ * dVar32;
                  auVar46 = vfmsub231sd_fma(auVar58,auVar61,auVar39);
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = pdVar16;
                  auVar50._8_8_ = 0;
                  auVar50._0_8_ = auVar34._0_8_ * (double)pdVar7;
                  auVar8 = vfmadd231sd_fma(auVar50,auVar8,auVar4);
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = dVar21;
                  auVar8 = vfmadd231sd_fma(auVar8,auVar46,auVar5);
                  if (0.004999999888241291 < auVar8._0_8_) {
                    bVar10 = false;
                    break;
                  }
                  *(uint *)&pdVar24[1]._vptr_dgRedBackNode = uVar19;
                  pdVar24 = pdVar24->m_right;
                  auVar62 = ZEXT1664(auVar37);
                  auVar64 = ZEXT1664(auVar39);
                  auVar66 = ZEXT1664(auVar44);
                } while (pdVar24 != pdVar22);
                if (bVar10) {
                  IStack_1a0a0.m_ptr = (dgRedBackNode *)0x0;
                  IStack_1a0a0.m_tree = &dStack_1a0e0.super_dgTree<dgEdge,_long>;
                  if (dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head == (dgTreeNode *)0x0) {
                    IStack_1a0a0.m_ptr = (dgRedBackNode *)0x0;
                  }
                  else {
                    IStack_1a0a0.m_ptr =
                         dgRedBackNode::Minimum
                                   (&(dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head)->
                                     super_dgRedBackNode);
                  }
                  while (IStack_1a0a0.m_ptr != (dgRedBackNode *)0x0) {
                    if ((*(int *)((long)&IStack_1a0a0.m_ptr[1]._vptr_dgRedBackNode + 4) < 0) &&
                       (*(int *)&IStack_1a0a0.m_ptr[2]._vptr_dgRedBackNode <= (int)uStack_1a090)) {
                      bVar10 = false;
                      goto LAB_00882392;
                    }
                    dgTree<dgEdge,_long>::Iterator::operator++(&IStack_1a0a0,0);
                  }
                  bVar10 = true;
                }
                else {
                  bVar10 = false;
                }
LAB_00882392:
                if (2 < (int)uStack_1a184 && bVar10) {
                  pdVar16 = pdVar22;
                  uVar26 = 0;
                  do {
                    uVar18 = uVar26;
                    aiStack_18034[uVar18 - 1] = *(int *)&pdVar16->_vptr_dgRedBackNode;
                    if (uVar18 == 0x1fff) {
                      __assert_fail("count < hacd::HaI32 (sizeof (polygon) / sizeof (polygon[0]))",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                    ,0xebe,
                                    "void dgPolyhedra::ConvexPartition(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                                   );
                    }
                    uVar26 = uVar18 + 1;
                    pdVar16 = pdVar16->m_right;
                  } while (pdVar16 != pdVar22);
                  bVar10 = true;
                  if (uVar26 != 1) {
                    uVar19 = 0;
                    do {
                      uVar27 = (ulong)(int)uVar19;
                      uVar28 = uVar18 & 0xffffffff;
                      uVar29 = uVar27;
                      if ((int)uVar18 < (int)uVar19) {
                        uVar28 = (ulong)uVar19;
                      }
                      do {
                        if (uVar28 == uVar29) goto LAB_0088240f;
                        piVar1 = aiStack_18034 + uVar29;
                        uVar29 = uVar29 + 1;
                      } while (aiStack_18034[uVar27 - 1] != *piVar1);
                      bVar10 = false;
                      uVar19 = (uint)uVar26;
LAB_0088240f:
                      uVar19 = uVar19 + 1;
                    } while ((int)uVar19 < (int)uVar18);
                  }
                }
                this = pdStack_1a0a8;
                if (bVar10) {
                  if (0 < (int)uStack_1a184) {
                    uVar26 = 0;
                    do {
                      DeleteEdge(&dStack_1a0e0,(dgEdge *)alStack_10038[uVar26]);
                      uVar26 = uVar26 + 1;
                      this = pdStack_1a0a8;
                    } while (uStack_1a184 != uVar26);
                  }
                }
                else if (0 < (int)uStack_1a184) {
                  uVar26 = 0;
                  do {
                    pdVar25 = (dgEdge *)alStack_10038[uVar26];
                    bVar10 = IsEssensialPointDiagonal(pdVar25,adStack_1a038,vertex,iVar11);
                    if ((!bVar10) &&
                       (bVar10 = IsEssensialPointDiagonal
                                           (pdVar25->m_twin,adStack_1a038,vertex,iVar11), !bVar10))
                    {
                      DeleteEdge(&dStack_1a0e0,pdVar25);
                    }
                    uVar26 = uVar26 + 1;
                    this = pdStack_1a0a8;
                  } while (uStack_1a184 != uVar26);
                }
              }
              uVar19 = dStack_1a0e0.m_edgeMark + 1;
              dStack_1a0e0.m_edgeMark = uVar19;
              if (uVar19 == 0x7fffffff) goto LAB_0088272c;
              adStack_1a038[0].super_dgTemplateVector<double>.m_x = 0.0;
              if (dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head == (dgTreeNode *)0x0) {
                adStack_1a038[0].super_dgTemplateVector<double>.m_x = 0.0;
                adStack_1a038[0].super_dgTemplateVector<double>.m_y = (double)&dStack_1a0e0;
              }
              else {
                adStack_1a038[0].super_dgTemplateVector<double>.m_y = (double)&dStack_1a0e0;
                adStack_1a038[0].super_dgTemplateVector<double>.m_x =
                     (double)dgRedBackNode::Minimum
                                       (&(dStack_1a0e0.super_dgTree<dgEdge,_long>.m_head)->
                                         super_dgRedBackNode);
              }
              while ((dgRedBackNode *)adStack_1a038[0].super_dgTemplateVector<double>.m_x !=
                     (dgRedBackNode *)0x0) {
                if ((*(uint *)&((dgRedBackNode *)
                               ((long)adStack_1a038[0].super_dgTemplateVector<double>.m_x + 0x50))->
                               _vptr_dgRedBackNode != uVar19) &&
                   (0 < *(int *)((long)&((dgRedBackNode *)
                                        ((long)adStack_1a038[0].super_dgTemplateVector<double>.m_x +
                                        0x28))->_vptr_dgRedBackNode + 4))) {
                  pdVar16 = (dgRedBackNode *)
                            ((long)adStack_1a038[0].super_dgTemplateVector<double>.m_x + 0x28);
                  uVar26 = 0;
                  do {
                    uVar18 = uVar26;
                    aiStack_18034[uVar18 - 1] = *(int *)&pdVar16->_vptr_dgRedBackNode;
                    if (uVar18 == 0x1fff) {
                      __assert_fail("diagonalCount < hacd::HaI32 (sizeof (polygon) / sizeof (polygon[0]))"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                    ,0xeea,
                                    "void dgPolyhedra::ConvexPartition(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                                   );
                    }
                    *(uint *)&pdVar16[1]._vptr_dgRedBackNode = uVar19;
                    pdVar16 = pdVar16->m_right;
                    uVar26 = uVar18 + 1;
                  } while (pdVar16 !=
                           (dgRedBackNode *)
                           ((long)adStack_1a038[0].super_dgTemplateVector<double>.m_x + 0x28));
                  if (1 < uVar18) {
                    AddFace(&dStack_1a060,(HaI32)(uVar18 + 1),&HStack_18038,(HaI64 *)0x0);
                  }
                }
                dgTree<dgEdge,_long>::Iterator::operator++((Iterator *)adStack_1a038,0);
              }
            }
            pdVar17 = ((dgTree<dgEdge,_long> *)&(IStack_1a0b8.m_tree)->_vptr_dgTree)->m_head;
            if (pdVar17 == (dgTreeNode *)0x0) {
              IStack_1a0b8.m_ptr = (dgRedBackNode *)0x0;
            }
            else {
              IStack_1a0b8.m_ptr = dgRedBackNode::Minimum(&pdVar17->super_dgRedBackNode);
            }
            ~dgPolyhedra(&dStack_1a0e0);
          }
        } while (IStack_1a0b8.m_ptr != (dgRedBackNode *)0x0);
      }
      EndFace(&dStack_1a060);
      iVar11 = (this->super_dgTree<dgEdge,_long>).m_count;
      if (iVar11 != 0) {
        __assert_fail("GetCount() == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                      ,0xefa,
                      "void dgPolyhedra::ConvexPartition(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                     );
      }
      pdVar17 = (this->super_dgTree<dgEdge,_long>).m_head;
      (this->super_dgTree<dgEdge,_long>).m_head = dStack_1a060.super_dgTree<dgEdge,_long>.m_head;
      (this->super_dgTree<dgEdge,_long>).m_count = dStack_1a060.super_dgTree<dgEdge,_long>.m_count;
      dStack_1a060.super_dgTree<dgEdge,_long>.m_count = iVar11;
      dStack_1a060.super_dgTree<dgEdge,_long>.m_head = pdVar17;
      ~dgPolyhedra(&dStack_1a060);
    }
  }
  return;
}

Assistant:

void dgPolyhedra::ConvexPartition (const hacd::HaF64* const vertex, hacd::HaI32 strideInBytes, dgPolyhedra* const leftOversOut)
{
	if (GetCount()) {
		Triangulate (vertex, strideInBytes, leftOversOut);
		DeleteDegenerateFaces (vertex, strideInBytes, hacd::HaF32 (1.0e-5f));
		Optimize (vertex, strideInBytes, hacd::HaF32 (1.0e-4f));
		DeleteDegenerateFaces (vertex, strideInBytes, hacd::HaF32 (1.0e-5f));

		if (GetCount()) {
			hacd::HaI32 removeCount = 0;
			hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF64));

			hacd::HaI32 polygon[1024 * 8];
			dgEdge* diagonalsPool[1024 * 8];
			dgPolyhedra buildConvex;

			buildConvex.BeginFace();
			dgPolyhedra::Iterator iter (*this);
			for (iter.Begin(); iter; ) {
				dgEdge* edge = &(*iter);
				iter++;
				if (edge->m_incidentFace > 0) {

					dgPolyhedra flatFace;
					MarkAdjacentCoplanarFaces (flatFace, edge, vertex, strideInBytes);

					if (flatFace.GetCount()) {
						flatFace.RefineTriangulation (vertex, stride);
						RemoveColinearVertices (flatFace, vertex, stride);

						hacd::HaI32 diagonalCount = GetInteriorDiagonals (flatFace, diagonalsPool, sizeof (diagonalsPool) / sizeof (diagonalsPool[0]));
						if (diagonalCount) {
							edge = &flatFace.GetRoot()->GetInfo();
							if (edge->m_incidentFace < 0) {
								edge = edge->m_twin;
							}
							HACD_ASSERT (edge->m_incidentFace > 0);

							dgBigVector normal (FaceNormal (edge, vertex, strideInBytes));
							normal = normal.Scale (hacd::HaF64 (1.0f) / sqrt (normal % normal));

							edge = NULL;
							dgPolyhedra::Iterator iter (flatFace);
							for (iter.Begin(); iter; iter ++) {
								edge = &(*iter);
								if (edge->m_incidentFace < 0) {
									break;
								}
							}
							HACD_ASSERT (edge);

							hacd::HaI32 isConvex = 1;
							dgEdge* ptr = edge;
							hacd::HaI32 mark = flatFace.IncLRU();

							dgBigVector normal2 (normal);
							dgBigVector p0 (&vertex[ptr->m_prev->m_incidentVertex * stride]);
							dgBigVector p1 (&vertex[ptr->m_incidentVertex * stride]);
							dgBigVector e0 (p1 - p0);
							e0 = e0.Scale (hacd::HaF32 (1.0f) / (dgSqrt (e0 % e0) + hacd::HaF32 (1.0e-14f)));
							do {
								dgBigVector p2 (&vertex[ptr->m_next->m_incidentVertex * stride]);
								dgBigVector e1 (p2 - p1);
								e1 = e1.Scale (hacd::HaF32 (1.0f) / (sqrt (e1 % e1) + hacd::HaF32 (1.0e-14f)));
								hacd::HaF64 dot = (e0 * e1) % normal2;
								//if (dot > hacd::HaF32 (0.0f)) {
								if (dot > hacd::HaF32 (5.0e-3f)) {
									isConvex = 0;
									break;
								}
								ptr->m_mark = mark;
								e0 = e1;
								p1 = p2;
								ptr = ptr->m_next;
							} while (ptr != edge);

							if (isConvex) {
								dgPolyhedra::Iterator iter (flatFace);
								for (iter.Begin(); iter; iter ++) {
									ptr = &(*iter);
									if (ptr->m_incidentFace < 0) {
										if (ptr->m_mark < mark) {
											isConvex = 0;
											break;
										}
									}
								}
							}

							if (isConvex) {
								if (diagonalCount > 2) {
									hacd::HaI32 count = 0;
									ptr = edge;
									do {
										polygon[count] = ptr->m_incidentVertex;				
										count ++;
										HACD_ASSERT (count < hacd::HaI32 (sizeof (polygon) / sizeof (polygon[0])));
										ptr = ptr->m_next;
									} while (ptr != edge);

									for (hacd::HaI32 i = 0; i < count - 1; i ++) {
										for (hacd::HaI32 j = i + 1; j < count; j ++) {
											if (polygon[i] == polygon[j]) {
												i = count;
												isConvex = 0;
												break ;
											}
										}
									}
								}
							}

							if (isConvex) {
								for (hacd::HaI32 j = 0; j < diagonalCount; j ++) {
									dgEdge* const diagonal = diagonalsPool[j];
									removeCount ++;
									flatFace.DeleteEdge (diagonal);
								}
							} else {
								for (hacd::HaI32 j = 0; j < diagonalCount; j ++) {
									dgEdge* const diagonal = diagonalsPool[j];
									if (!IsEssensialDiagonal(diagonal, normal, vertex, stride)) {
										removeCount ++;
										flatFace.DeleteEdge (diagonal);
									}
								}
							}
						}

						hacd::HaI32 mark = flatFace.IncLRU();
						dgPolyhedra::Iterator iter (flatFace);
						for (iter.Begin(); iter; iter ++) {
							dgEdge* const edge = &(*iter);
							if (edge->m_mark != mark) {
								if (edge->m_incidentFace > 0) {
									dgEdge* ptr = edge;
									hacd::HaI32 diagonalCount = 0;
									do {
										polygon[diagonalCount] = ptr->m_incidentVertex;				
										diagonalCount ++;
										HACD_ASSERT (diagonalCount < hacd::HaI32 (sizeof (polygon) / sizeof (polygon[0])));
										ptr->m_mark = mark;
										ptr = ptr->m_next;
									} while (ptr != edge);
									if (diagonalCount >= 3) {
										buildConvex.AddFace (diagonalCount, polygon);
									}
								}
							}
						}
					}
					iter.Begin();
				}
			}

			buildConvex.EndFace();
			HACD_ASSERT (GetCount() == 0);
			SwapInfo(buildConvex);
		}
	}
}